

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

void __thiscall
soul::AST::ModuleBase::ModuleBase
          (ModuleBase *this,ObjectType ot,CodeLocation *processorKeyword,Context *processorName,
          Identifier moduleName)

{
  Context *processorName_local;
  CodeLocation *processorKeyword_local;
  ObjectType ot_local;
  ModuleBase *this_local;
  Identifier moduleName_local;
  
  ASTObject::ASTObject(&this->super_ASTObject,ot,processorName);
  Scope::Scope(&this->super_Scope);
  (this->super_ASTObject)._vptr_ASTObject = (_func_int **)&PTR__ModuleBase_00585248;
  (this->super_Scope)._vptr_Scope = (_func_int **)&PTR__ModuleBase_005852f8;
  CodeLocation::CodeLocation(&this->processorKeywordLocation,processorKeyword);
  (this->name).name = moduleName.name;
  this->isFullyResolved = false;
  std::
  vector<soul::pool_ref<soul::AST::ASTObject>,_std::allocator<soul::pool_ref<soul::AST::ASTObject>_>_>
  ::vector(&this->specialisationParams);
  std::
  vector<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
  ::vector(&this->usings);
  std::
  vector<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>,_std::allocator<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>_>_>
  ::vector(&this->namespaceAliases);
  std::
  vector<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>
  ::vector(&this->structures);
  std::
  vector<soul::pool_ref<soul::AST::StaticAssertion>,_std::allocator<soul::pool_ref<soul::AST::StaticAssertion>_>_>
  ::vector(&this->staticAssertions);
  std::
  function<soul::AST::ModuleBase_&(soul::AST::Allocator_&,_soul::AST::Namespace_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&this->createClone);
  pool_ptr<soul::AST::ModuleBase>::pool_ptr(&this->originalModule);
  return;
}

Assistant:

ModuleBase (ObjectType ot, CodeLocation processorKeyword, const Context& processorName, Identifier moduleName)
            : ASTObject (ot, processorName), processorKeywordLocation (std::move (processorKeyword)), name (moduleName) {}